

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_ReversePointGrid(int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
                        int point_stride1,double *p,int dir)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  
  bVar6 = dir == 0;
  do {
    bVar1 = bVar6;
    uVar2 = point_count0;
    iVar5 = point_stride0;
    point_stride0 = point_stride1;
    point_count0 = point_count1;
    uVar4 = 0;
    point_count1 = uVar2;
    point_stride1 = iVar5;
    bVar6 = false;
  } while (bVar1);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  bVar6 = false;
  while( true ) {
    if (uVar3 == uVar4) {
      return bVar6;
    }
    bVar1 = ON_ReversePointList(dim,is_rat,point_count0,point_stride0,p);
    if (!bVar1) break;
    bVar6 = (bool)(bVar6 | uVar4 == 0);
    uVar4 = uVar4 + 1;
    p = p + iVar5;
  }
  return false;
}

Assistant:

bool 
ON_ReversePointGrid(
        int dim,
        bool is_rat,
        int point_count0, int point_count1,
        int point_stride0, int point_stride1,
        double* p,
        int dir
        )
{
  bool rc = false;
  if ( !dir ) {
    rc = ON_ReversePointGrid( dim, is_rat, point_count1, point_count0, point_stride1, point_stride0, p, 1 );
  }
  else {
    int i;
    for ( i = 0; i < point_count0; i++ ) {
      if ( !ON_ReversePointList( dim, is_rat, point_count1, point_stride1, p + i*point_stride0 ) ) {
        rc = false;
        break;
      }
      else if (!i) {
        rc = true;
      }
    }
  }
  return rc;
}